

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

TaggedUnionExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::TaggedUnionExpressionSyntax,slang::syntax::TaggedUnionExpressionSyntax_const&>
          (BumpAllocator *this,TaggedUnionExpressionSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  Info *pIVar4;
  ExpressionSyntax *pEVar5;
  undefined4 uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  TaggedUnionExpressionSyntax *pTVar15;
  
  pTVar15 = (TaggedUnionExpressionSyntax *)allocate(this,0x40,8);
  uVar6 = *(undefined4 *)&(args->super_ExpressionSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_ExpressionSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_ExpressionSyntax).super_SyntaxNode.previewNode;
  TVar7 = (args->tagged).kind;
  uVar8 = (args->tagged).field_0x2;
  NVar9.raw = (args->tagged).numFlags.raw;
  uVar10 = (args->tagged).rawLen;
  pIVar3 = (args->tagged).info;
  TVar11 = (args->member).kind;
  uVar12 = (args->member).field_0x2;
  NVar13.raw = (args->member).numFlags.raw;
  uVar14 = (args->member).rawLen;
  pIVar4 = (args->member).info;
  pEVar5 = args->expr;
  (pTVar15->super_ExpressionSyntax).super_SyntaxNode.kind =
       (args->super_ExpressionSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pTVar15->super_ExpressionSyntax).super_SyntaxNode.field_0x4 = uVar6;
  (pTVar15->super_ExpressionSyntax).super_SyntaxNode.parent = pSVar1;
  (pTVar15->super_ExpressionSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pTVar15->tagged).kind = TVar7;
  (pTVar15->tagged).field_0x2 = uVar8;
  (pTVar15->tagged).numFlags = (NumericTokenFlags)NVar9.raw;
  (pTVar15->tagged).rawLen = uVar10;
  (pTVar15->tagged).info = pIVar3;
  (pTVar15->member).kind = TVar11;
  (pTVar15->member).field_0x2 = uVar12;
  (pTVar15->member).numFlags = (NumericTokenFlags)NVar13.raw;
  (pTVar15->member).rawLen = uVar14;
  (pTVar15->member).info = pIVar4;
  pTVar15->expr = pEVar5;
  return pTVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }